

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::verifyRenderbuffers
               (TestLog *log,ResultCollector *results,RenderContext *renderContext,
               RenderbufferVector *renderbuffers,Framebuffer *framebuffer,
               vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *refRenderbuffers)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  int height_00;
  undefined4 extraout_var;
  size_t sVar5;
  const_reference this;
  PixelBufferAccess local_c8;
  TextureFormat local_90;
  undefined1 local_88 [8];
  TextureLevel result;
  TextureFormat format;
  int height;
  int width;
  TextureLevel *refRenderbuffer;
  int renderbufferNdx;
  Functions *gl;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *refRenderbuffers_local;
  Framebuffer *framebuffer_local;
  RenderbufferVector *renderbuffers_local;
  RenderContext *renderContext_local;
  ResultCollector *results_local;
  TestLog *log_local;
  long lVar4;
  
  iVar2 = (*renderContext->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(lVar4 + 0x78);
  dVar3 = glu::ObjectWrapper::operator*(&framebuffer->super_ObjectWrapper);
  (*pcVar1)(0x8d40,dVar3);
  refRenderbuffer._4_4_ = 0;
  while( true ) {
    sVar5 = glu::ObjectVector::size(&renderbuffers->super_ObjectVector);
    if ((int)sVar5 <= refRenderbuffer._4_4_) break;
    this = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                     (refRenderbuffers,(long)refRenderbuffer._4_4_);
    iVar2 = tcu::TextureLevel::getWidth(this);
    height_00 = tcu::TextureLevel::getHeight(this);
    result.m_data.m_cap = (size_t)tcu::TextureLevel::getFormat(this);
    local_90 = getReadPixelFormat((TextureFormat *)&result.m_data.m_cap);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_88,&local_90,iVar2,height_00,1);
    (**(code **)(lVar4 + 0x1218))(refRenderbuffer._4_4_ + 0x8ce0);
    tcu::TextureLevel::getAccess(&local_c8,(TextureLevel *)local_88);
    glu::readPixels(renderContext,0,0,&local_c8);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Reading pixels from renderbuffer failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                    ,0x234);
    verifyRenderbuffer(log,results,(TextureFormat *)&result.m_data.m_cap,refRenderbuffer._4_4_,this,
                       (TextureLevel *)local_88);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_88);
    refRenderbuffer._4_4_ = refRenderbuffer._4_4_ + 1;
  }
  (**(code **)(lVar4 + 0x78))(0x8d40,0);
  return;
}

Assistant:

void verifyRenderbuffers (TestLog&							log,
							tcu::ResultCollector&				results,
							glu::RenderContext&				renderContext,
							const glu::RenderbufferVector&	renderbuffers,
							const glu::Framebuffer&			framebuffer,
							const vector<TextureLevel>&		refRenderbuffers)
{
	const glw::Functions& gl = renderContext.getFunctions();

	DE_ASSERT(renderbuffers.size() == refRenderbuffers.size());

	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);

	for (int renderbufferNdx = 0; renderbufferNdx < (int)renderbuffers.size(); renderbufferNdx++)
	{
		const TextureLevel&	refRenderbuffer	= refRenderbuffers[renderbufferNdx];
		const int			width			= refRenderbuffer.getWidth();
		const int			height			= refRenderbuffer.getHeight();
		const TextureFormat	format			= refRenderbuffer.getFormat();

		tcu::TextureLevel	result			(getReadPixelFormat(format), width, height);

		gl.readBuffer(GL_COLOR_ATTACHMENT0 + renderbufferNdx);
		glu::readPixels(renderContext, 0, 0, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels from renderbuffer failed.");

		verifyRenderbuffer(log, results, format, renderbufferNdx, refRenderbuffer, result);
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}